

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>const,1,-1,true>const,1,-1,false>const,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>const,0,Eigen::Stride<0,0>>const,-1,1,false>const>const>>,3,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>>const,1,_1,true>const,1,_1,false>const,Eigen::Transpose<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>const,_1,1,false>const>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
                  *eval,scalar_sum_op<float,_float> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>
                 *xpr)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  Index index;
  long lVar8;
  long lVar9;
  long lVar10;
  Scalar SVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  lVar5 = (xpr->m_rhs).m_matrix.
          super_BlockImpl<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_0>
          .m_rows.m_value;
  lVar9 = 8;
  lVar8 = lVar5 / 8;
  pfVar6 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
           .m_d.lhsImpl.
           super_evaluator<Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>_>
           .
           super_block_evaluator<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>
           .m_data;
  pfVar7 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_true>,_1,__1,_false>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
           .m_d.rhsImpl.
           super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>_>
           .
           super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
           .m_argImpl.
           super_evaluator<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
           .
           super_block_evaluator<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Map<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
           .m_data;
  if (lVar5 + 3U < 7) {
    SVar11 = *pfVar6 * *pfVar7;
    for (lVar9 = 1; lVar9 < lVar5; lVar9 = lVar9 + 1) {
      SVar11 = SVar11 + pfVar6[lVar9] * pfVar7[lVar9];
    }
  }
  else {
    lVar10 = (lVar5 / 4) * 4;
    fVar12 = *pfVar7 * *pfVar6;
    fVar13 = pfVar7[1] * pfVar6[1];
    fVar14 = pfVar7[2] * pfVar6[2];
    fVar15 = pfVar7[3] * pfVar6[3];
    if (7 < lVar5) {
      fVar16 = pfVar7[4] * pfVar6[4];
      fVar17 = pfVar7[5] * pfVar6[5];
      fVar18 = pfVar7[6] * pfVar6[6];
      fVar19 = pfVar7[7] * pfVar6[7];
      for (; lVar9 < lVar8 * 8; lVar9 = lVar9 + 8) {
        pfVar1 = pfVar6 + lVar9;
        pfVar3 = pfVar6 + lVar9 + 4;
        pfVar2 = pfVar7 + lVar9;
        pfVar4 = pfVar7 + lVar9 + 4;
        fVar12 = fVar12 + *pfVar2 * *pfVar1;
        fVar13 = fVar13 + pfVar2[1] * pfVar1[1];
        fVar14 = fVar14 + pfVar2[2] * pfVar1[2];
        fVar15 = fVar15 + pfVar2[3] * pfVar1[3];
        fVar16 = fVar16 + *pfVar4 * *pfVar3;
        fVar17 = fVar17 + pfVar4[1] * pfVar3[1];
        fVar18 = fVar18 + pfVar4[2] * pfVar3[2];
        fVar19 = fVar19 + pfVar4[3] * pfVar3[3];
      }
      fVar12 = fVar12 + fVar16;
      fVar13 = fVar13 + fVar17;
      fVar14 = fVar14 + fVar18;
      fVar15 = fVar15 + fVar19;
      if (lVar8 * 8 < lVar10) {
        pfVar1 = pfVar6 + lVar8 * 8;
        pfVar2 = pfVar7 + lVar8 * 8;
        fVar12 = fVar12 + *pfVar2 * *pfVar1;
        fVar13 = fVar13 + pfVar2[1] * pfVar1[1];
        fVar14 = fVar14 + pfVar2[2] * pfVar1[2];
        fVar15 = fVar15 + pfVar2[3] * pfVar1[3];
      }
    }
    SVar11 = fVar15 + fVar13 + fVar14 + fVar12;
    for (; lVar10 < lVar5; lVar10 = lVar10 + 1) {
      SVar11 = SVar11 + pfVar6[lVar10] * pfVar7[lVar10];
    }
  }
  return SVar11;
}

Assistant:

void setValue(T value) { m_value = value; }